

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta,float objective_amplifier)

{
  uint *args_1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined1 auVar1 [16];
  bool bVar2;
  uint r_size;
  uint uVar3;
  long lVar4;
  row_iterator prVar5;
  ulong uVar6;
  rc_data *__first;
  rc_data *__last;
  undefined1 auVar7 [64];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_80;
  int local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  int *local_68;
  int *local_60;
  bit_array *local_58;
  solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *local_50;
  undefined8 local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  undefined1 extraout_var [60];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_78 = objective_amplifier;
  local_74 = theta;
  local_70 = delta;
  local_6c = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_6c,&local_70,&local_74);
  if (first._M_current == last._M_current) {
    local_48 = 0;
  }
  else {
    local_50 = this + 0x10;
    local_48 = 0;
    local_68 = last._M_current;
    local_58 = x;
    do {
      local_80 = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_50);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar4 = *(long *)(this + 0x50);
        prVar5 = local_38;
        do {
          *(float *)(lVar4 + (long)prVar5->value * 4) =
               local_74 * *(float *)(lVar4 + (long)prVar5->value * 4);
          prVar5 = prVar5 + 1;
        } while (prVar5 != (row_iterator)local_40._M_head_impl);
      }
      r_size = solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                           *)this,local_38,(row_iterator)local_40._M_head_impl,x);
      if (r_size != 0) {
        uVar6 = 0;
        do {
          auVar7._0_4_ = quadratic_cost_type<float>::operator()
                                   (*(quadratic_cost_type<float> **)(this + 0x70),
                                    *(int *)(*(long *)(this + 0x58) + 4 + uVar6 * 8),x);
          auVar7._4_60_ = extraout_var;
          auVar1 = vfmadd213ss_fma(auVar7._0_16_,ZEXT416((uint)local_78),
                                   ZEXT416(*(uint *)(*(long *)(this + 0x58) + uVar6 * 8)));
          *(int *)(*(long *)(this + 0x58) + uVar6 * 8) = auVar1._0_4_;
          uVar6 = uVar6 + 1;
        } while (r_size != uVar6);
      }
      if (1 < (int)r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        lVar4 = (long)(int)r_size;
        __first = *(rc_data **)(this + 0x58);
        local_60 = first._M_current;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar4,(int)LZCOUNT(lVar4) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar4);
        __last = __first + 1;
        lVar4 = lVar4 * 8 + -8;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar4 = lVar4 + -8;
        } while (lVar4 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        last._M_current = local_68;
        first._M_current = local_60;
      }
      args_1 = (uint *)(*(long *)(this + 0x60) + (long)local_80 * 4);
      uVar3 = *args_1;
      if ((int)r_size < (int)uVar3) {
        uVar3 = r_size;
      }
      local_7c = uVar3 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_80,(int *)args_1);
      if (0 < (int)r_size) {
        lVar4 = 0;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<float,int>
                    ((debug_logger<true> *)this,fmt_01,(float *)(*(long *)(this + 0x58) + lVar4),
                     (int *)(*(long *)(this + 0x58) + 4 + lVar4));
          lVar4 = lVar4 + 8;
        } while ((ulong)r_size << 3 != lVar4);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_7c);
      x = local_58;
      bVar2 = affect<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)this,local_58,local_38,local_80,local_7c,r_size,local_6c,local_70);
      local_48 = CONCAT71((int7)((ulong)local_48 >> 8),(byte)local_48 | bVar2);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)local_48 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }